

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O3

char * duckdb::TryGetEnv(char *name)

{
  char *pcVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  pcVar1 = getenv(name);
  if (pcVar1 == (char *)0x0) {
    ::std::__cxx11::string::string((string *)&local_58,name,&local_59);
    StringUtil::Upper(&local_38,&local_58);
    pcVar1 = getenv(local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return pcVar1;
}

Assistant:

static const char *TryGetEnv(const char *name) {
	const char *res = std::getenv(name);
	if (res) {
		return res;
	}
	return std::getenv(StringUtil::Upper(name).c_str());
}